

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventmultiplexer.cxx
# Opt level: O1

bool __thiscall EventMultiplexer::addSource(EventMultiplexer *this,StochasticEventGenerator *source)

{
  pointer *pppSVar1;
  pointer ppSVar2;
  iterator __position;
  StochasticEventGenerator *local_20;
  
  ppSVar2 = (this->multiSources).
            super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->multiSources).
       super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->multiSources).
      super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20 = source;
    std::vector<StochasticEventGenerator*,std::allocator<StochasticEventGenerator*>>::
    _M_realloc_insert<StochasticEventGenerator*const&>
              ((vector<StochasticEventGenerator*,std::allocator<StochasticEventGenerator*>> *)
               &this->multiSources,__position,&local_20);
  }
  else {
    *__position._M_current = source;
    pppSVar1 = &(this->multiSources).
                super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  return (long)(this->multiSources).
               super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->multiSources).
               super__Vector_base<StochasticEventGenerator_*,_std::allocator<StochasticEventGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3 ==
         (ulong)((int)((ulong)((long)__position._M_current - (long)ppSVar2) >> 3) + 1);
}

Assistant:

bool EventMultiplexer::addSource( StochasticEventGenerator *source )
{
	uint sizeBefore = multiSources.size();
	multiSources.push_back(source);

	return multiSources.size() == sizeBefore+1;
}